

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O0

int get_param_part(OperationConfig *config,char endchar,char **str,char **pdata,char **ptype,
                  char **pfilename,char **pencoder,curl_slist **pheaders)

{
  byte *pbVar1;
  GlobalConfig *config_00;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  FILE *__stream;
  int *piVar6;
  char *pcVar7;
  bool bVar8;
  char *unknown;
  char *hdr;
  int i;
  FILE *fp;
  char *hdrfile;
  curl_slist *headers;
  char *endct;
  char type_minor [128];
  char type_major [128];
  char sep;
  char *tp;
  char *endpos;
  char *encoder;
  char *filename;
  char *type;
  char *p;
  char **pfilename_local;
  char **ptype_local;
  char **pdata_local;
  char **str_local;
  OperationConfig *pOStack_18;
  char endchar_local;
  OperationConfig *config_local;
  
  type = *str;
  filename = (char *)0x0;
  encoder = (char *)0x0;
  endpos = (char *)0x0;
  p = (char *)pfilename;
  pfilename_local = ptype;
  ptype_local = pdata;
  pdata_local = str;
  str_local._7_1_ = endchar;
  pOStack_18 = config;
  memset(type_minor + 0x78,0,0x80);
  memset(&endct,0,0x80);
  headers = (curl_slist *)0x0;
  hdrfile = (char *)0x0;
  if (pfilename_local != (char **)0x0) {
    *pfilename_local = (char *)0x0;
  }
  if (p != (char *)0x0) {
    p[0] = '\0';
    p[1] = '\0';
    p[2] = '\0';
    p[3] = '\0';
    p[4] = '\0';
    p[5] = '\0';
    p[6] = '\0';
    p[7] = '\0';
  }
  if (pheaders != (curl_slist **)0x0) {
    *pheaders = (curl_slist *)0x0;
  }
  if (pencoder != (char **)0x0) {
    *pencoder = (char *)0x0;
  }
  while (iVar2 = Curl_isspace((uint)(byte)*type), pcVar7 = type, iVar2 != 0) {
    type = type + 1;
  }
  pcVar3 = get_param_word(&type,&tp,str_local._7_1_);
  *ptype_local = pcVar3;
  if (*ptype_local == pcVar7) {
    while( true ) {
      bVar8 = false;
      if (*ptype_local < tp) {
        iVar2 = Curl_isspace((uint)(byte)tp[-1]);
        bVar8 = iVar2 != 0;
      }
      if (!bVar8) break;
      tp = tp + -1;
    }
  }
  type_major[0x7f] = *type;
  *tp = '\0';
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            if (type_major[0x7f] != ';') {
              if (headers != (curl_slist *)0x0) {
                *(undefined1 *)&headers->data = 0;
              }
              if (pfilename_local == (char **)0x0) {
                if (filename != (char *)0x0) {
                  warnf(pOStack_18->global,"Field content type not allowed here: %s\n",filename);
                }
              }
              else {
                *pfilename_local = filename;
              }
              if (p == (char *)0x0) {
                if (encoder != (char *)0x0) {
                  warnf(pOStack_18->global,"Field file name not allowed here: %s\n",encoder);
                }
              }
              else {
                *(char **)p = encoder;
              }
              if (pencoder == (char **)0x0) {
                if (endpos != (char *)0x0) {
                  warnf(pOStack_18->global,"Field encoder not allowed here: %s\n",endpos);
                }
              }
              else {
                *pencoder = endpos;
              }
              if (pheaders == (curl_slist **)0x0) {
                if (hdrfile != (char *)0x0) {
                  warnf(pOStack_18->global,"Field headers not allowed here: %s\n",
                        *(undefined8 *)hdrfile);
                  curl_slist_free_all(hdrfile);
                }
              }
              else {
                *pheaders = (curl_slist *)hdrfile;
              }
              *pdata_local = type;
              return (uint)(byte)type_major[0x7f];
            }
            do {
              pbVar1 = (byte *)(type + 1);
              type = type + 1;
              iVar2 = Curl_isspace((uint)*pbVar1);
            } while (iVar2 != 0);
            if ((headers != (curl_slist *)0x0) ||
               (iVar2 = curl_strnequal("type=",type,5), iVar2 == 0)) break;
            type = type + 5;
            while (iVar2 = Curl_isspace((uint)(byte)*type), iVar2 != 0) {
              type = type + 1;
            }
            filename = type;
            iVar2 = __isoc99_sscanf(type,"%127[^/ ]/%127[^;, \n]",type_minor + 0x78,&endct);
            pcVar7 = filename;
            if (iVar2 != 2) {
              warnf(pOStack_18->global,"Illegally formatted content-type field!\n");
              curl_slist_free_all(hdrfile);
              return -1;
            }
            sVar4 = strlen(type_minor + 0x78);
            sVar5 = strlen((char *)&endct);
            headers = (curl_slist *)(pcVar7 + sVar5 + sVar4 + 1);
            type = (char *)headers;
            while( true ) {
              bVar8 = false;
              if ((*type != '\0') && (bVar8 = false, *type != ';')) {
                bVar8 = *type != str_local._7_1_;
              }
              if (!bVar8) break;
              iVar2 = Curl_isspace((uint)(byte)*type);
              if (iVar2 == 0) {
                headers = (curl_slist *)(type + 1);
              }
              type = type + 1;
            }
            type_major[0x7f] = *type;
          }
          iVar2 = curl_strnequal("filename=",type,9);
          if (iVar2 == 0) break;
          if (headers != (curl_slist *)0x0) {
            *(undefined1 *)&headers->data = 0;
            headers = (curl_slist *)0x0;
          }
          type = type + 9;
          while (iVar2 = Curl_isspace((uint)(byte)*type), pcVar7 = type, iVar2 != 0) {
            type = type + 1;
          }
          encoder = get_param_word(&type,&tp,str_local._7_1_);
          if (encoder == pcVar7) {
            while( true ) {
              bVar8 = false;
              if (encoder < tp) {
                iVar2 = Curl_isspace((uint)(byte)tp[-1]);
                bVar8 = iVar2 != 0;
              }
              if (!bVar8) break;
              tp = tp + -1;
            }
          }
          type_major[0x7f] = *type;
          *tp = '\0';
        }
        iVar2 = curl_strnequal("headers=",type,8);
        if (iVar2 != 0) break;
        iVar2 = curl_strnequal("encoder=",type,8);
        if (iVar2 == 0) {
          if (headers == (curl_slist *)0x0) {
            pcVar7 = get_param_word(&type,&tp,str_local._7_1_);
            type_major[0x7f] = *type;
            *tp = '\0';
            if (*pcVar7 != '\0') {
              warnf(pOStack_18->global,"skip unknown form field: %s\n",pcVar7);
            }
          }
          else {
            headers = (curl_slist *)type;
            while( true ) {
              bVar8 = false;
              if ((*type != '\0') && (bVar8 = false, *type != ';')) {
                bVar8 = *type != str_local._7_1_;
              }
              if (!bVar8) break;
              iVar2 = Curl_isspace((uint)(byte)*type);
              if (iVar2 == 0) {
                headers = (curl_slist *)(type + 1);
              }
              type = type + 1;
            }
            type_major[0x7f] = *type;
          }
        }
        else {
          if (headers != (curl_slist *)0x0) {
            *(undefined1 *)&headers->data = 0;
            headers = (curl_slist *)0x0;
          }
          type = type + 8;
          while (iVar2 = Curl_isspace((uint)(byte)*type), pcVar7 = type, iVar2 != 0) {
            type = type + 1;
          }
          endpos = get_param_word(&type,&tp,str_local._7_1_);
          if (endpos == pcVar7) {
            while( true ) {
              bVar8 = false;
              if (endpos < tp) {
                iVar2 = Curl_isspace((uint)(byte)tp[-1]);
                bVar8 = iVar2 != 0;
              }
              if (!bVar8) break;
              tp = tp + -1;
            }
          }
          type_major[0x7f] = *type;
          *tp = '\0';
        }
      }
      if (headers != (curl_slist *)0x0) {
        *(undefined1 *)&headers->data = 0;
        headers = (curl_slist *)0x0;
      }
      type = type + 8;
      if ((*type != '@') && (*type != '<')) break;
      do {
        type = type + 1;
        iVar2 = Curl_isspace((uint)(byte)*type);
        pcVar7 = type;
      } while (iVar2 != 0);
      pcVar3 = get_param_word(&type,&tp,str_local._7_1_);
      if (pcVar3 == pcVar7) {
        while( true ) {
          bVar8 = false;
          if (pcVar3 < tp) {
            iVar2 = Curl_isspace((uint)(byte)tp[-1]);
            bVar8 = iVar2 != 0;
          }
          if (!bVar8) break;
          tp = tp + -1;
        }
      }
      type_major[0x7f] = *type;
      *tp = '\0';
      __stream = fopen64(pcVar3,"r");
      if (__stream == (FILE *)0x0) {
        config_00 = pOStack_18->global;
        piVar6 = __errno_location();
        pcVar7 = strerror(*piVar6);
        warnf(config_00,"Cannot read from %s: %s\n",pcVar3,pcVar7);
      }
      else {
        iVar2 = read_field_headers(pOStack_18,pcVar3,(FILE *)__stream,(curl_slist **)&hdrfile);
        fclose(__stream);
        if (iVar2 != 0) {
          curl_slist_free_all(hdrfile);
          return -1;
        }
      }
    }
    while (iVar2 = Curl_isspace((uint)(byte)*type), pcVar7 = type, iVar2 != 0) {
      type = type + 1;
    }
    pcVar3 = get_param_word(&type,&tp,str_local._7_1_);
    if (pcVar3 == pcVar7) {
      while( true ) {
        bVar8 = false;
        if (pcVar3 < tp) {
          iVar2 = Curl_isspace((uint)(byte)tp[-1]);
          bVar8 = iVar2 != 0;
        }
        if (!bVar8) break;
        tp = tp + -1;
      }
    }
    type_major[0x7f] = *type;
    *tp = '\0';
    iVar2 = slist_append((curl_slist **)&hdrfile,pcVar3);
  } while (iVar2 == 0);
  curl_mfprintf(pOStack_18->global->errors,"Out of memory for field header!\n");
  curl_slist_free_all(hdrfile);
  return -1;
}

Assistant:

static int get_param_part(struct OperationConfig *config, char endchar,
                          char **str, char **pdata, char **ptype,
                          char **pfilename, char **pencoder,
                          struct curl_slist **pheaders)
{
  char *p = *str;
  char *type = NULL;
  char *filename = NULL;
  char *encoder = NULL;
  char *endpos;
  char *tp;
  char sep;
  char type_major[128] = "";
  char type_minor[128] = "";
  char *endct = NULL;
  struct curl_slist *headers = NULL;

  if(ptype)
    *ptype = NULL;
  if(pfilename)
    *pfilename = NULL;
  if(pheaders)
    *pheaders = NULL;
  if(pencoder)
    *pencoder = NULL;
  while(ISSPACE(*p))
    p++;
  tp = p;
  *pdata = get_param_word(&p, &endpos, endchar);
  /* If not quoted, strip trailing spaces. */
  if(*pdata == tp)
    while(endpos > *pdata && ISSPACE(endpos[-1]))
      endpos--;
  sep = *p;
  *endpos = '\0';
  while(sep == ';') {
    while(ISSPACE(*++p))
      ;

    if(!endct && checkprefix("type=", p)) {
      for(p += 5; ISSPACE(*p); p++)
        ;
      /* set type pointer */
      type = p;

      /* verify that this is a fine type specifier */
      if(2 != sscanf(type, "%127[^/ ]/%127[^;, \n]", type_major, type_minor)) {
        warnf(config->global, "Illegally formatted content-type field!\n");
        curl_slist_free_all(headers);
        return -1; /* illegal content-type syntax! */
      }

      /* now point beyond the content-type specifier */
      p = type + strlen(type_major) + strlen(type_minor) + 1;
      for(endct = p; *p && *p != ';' && *p != endchar; p++)
        if(!ISSPACE(*p))
          endct = p + 1;
      sep = *p;
    }
    else if(checkprefix("filename=", p)) {
      if(endct) {
        *endct = '\0';
        endct = NULL;
      }
      for(p += 9; ISSPACE(*p); p++)
        ;
      tp = p;
      filename = get_param_word(&p, &endpos, endchar);
      /* If not quoted, strip trailing spaces. */
      if(filename == tp)
        while(endpos > filename && ISSPACE(endpos[-1]))
          endpos--;
      sep = *p;
      *endpos = '\0';
    }
    else if(checkprefix("headers=", p)) {
      if(endct) {
        *endct = '\0';
        endct = NULL;
      }
      p += 8;
      if(*p == '@' || *p == '<') {
        char *hdrfile;
        FILE *fp;
        /* Read headers from a file. */

        do {
          p++;
        } while(ISSPACE(*p));
        tp = p;
        hdrfile = get_param_word(&p, &endpos, endchar);
        /* If not quoted, strip trailing spaces. */
        if(hdrfile == tp)
          while(endpos > hdrfile && ISSPACE(endpos[-1]))
            endpos--;
        sep = *p;
        *endpos = '\0';
        /* TODO: maybe special fopen for VMS? */
        fp = fopen(hdrfile, FOPEN_READTEXT);
        if(!fp)
          warnf(config->global, "Cannot read from %s: %s\n", hdrfile,
                strerror(errno));
        else {
          int i = read_field_headers(config, hdrfile, fp, &headers);

          fclose(fp);
          if(i) {
            curl_slist_free_all(headers);
            return -1;
          }
        }
      }
      else {
        char *hdr;

        while(ISSPACE(*p))
          p++;
        tp = p;
        hdr = get_param_word(&p, &endpos, endchar);
        /* If not quoted, strip trailing spaces. */
        if(hdr == tp)
          while(endpos > hdr && ISSPACE(endpos[-1]))
            endpos--;
        sep = *p;
        *endpos = '\0';
        if(slist_append(&headers, hdr)) {
          fprintf(config->global->errors, "Out of memory for field header!\n");
          curl_slist_free_all(headers);
          return -1;
        }
      }
    }
    else if(checkprefix("encoder=", p)) {
      if(endct) {
        *endct = '\0';
        endct = NULL;
      }
      for(p += 8; ISSPACE(*p); p++)
        ;
      tp = p;
      encoder = get_param_word(&p, &endpos, endchar);
      /* If not quoted, strip trailing spaces. */
      if(encoder == tp)
        while(endpos > encoder && ISSPACE(endpos[-1]))
          endpos--;
      sep = *p;
      *endpos = '\0';
    }
    else if(endct) {
      /* This is part of content type. */
      for(endct = p; *p && *p != ';' && *p != endchar; p++)
        if(!ISSPACE(*p))
          endct = p + 1;
      sep = *p;
    }
    else {
      /* unknown prefix, skip to next block */
      char *unknown = get_param_word(&p, &endpos, endchar);

      sep = *p;
      *endpos = '\0';
      if(*unknown)
        warnf(config->global, "skip unknown form field: %s\n", unknown);
    }
  }

  /* Terminate content type. */
  if(endct)
    *endct = '\0';

  if(ptype)
    *ptype = type;
  else if(type)
    warnf(config->global, "Field content type not allowed here: %s\n", type);

  if(pfilename)
    *pfilename = filename;
  else if(filename)
    warnf(config->global,
          "Field file name not allowed here: %s\n", filename);

  if(pencoder)
    *pencoder = encoder;
  else if(encoder)
    warnf(config->global,
          "Field encoder not allowed here: %s\n", encoder);

  if(pheaders)
    *pheaders = headers;
  else if(headers) {
    warnf(config->global,
          "Field headers not allowed here: %s\n", headers->data);
    curl_slist_free_all(headers);
  }

  *str = p;
  return sep & 0xFF;
}